

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_protocol_check_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  _ENetListNode **pp_Var1;
  byte *pbVar2;
  ENetList *pEVar3;
  ENetList *pEVar4;
  short *psVar5;
  short sVar6;
  short sVar7;
  ushort uVar8;
  size_t sVar9;
  _ENetListNode *p_Var10;
  _ENetListNode *p_Var11;
  bool bVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  bool bVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  byte bVar29;
  long lVar30;
  ulong uVar31;
  undefined4 *puVar32;
  byte bVar33;
  long lVar34;
  _ENetListNode *p_Var35;
  ENetListIterator result;
  _ENetListNode *p_Var36;
  uint uVar37;
  int local_80;
  long local_60;
  
  lVar30 = host->commandCount * 0x30 + 0x8c;
  lVar34 = host->bufferCount * 0x10 + 0x698;
  pEVar3 = &peer->outgoingCommands;
  p_Var35 = (peer->outgoingCommands).sentinel.next;
  if (p_Var35 == &pEVar3->sentinel) {
    local_80 = 1;
LAB_001080f6:
    host->commandCount = (lVar30 + -0x8c >> 4) * -0x5555555555555555;
    host->bufferCount = lVar34 + -0x698 >> 4;
    if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
        ((pEVar3->sentinel).next == &pEVar3->sentinel)) &&
       (((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel &&
        ((peer->sentUnreliableCommands).sentinel.next == &(peer->sentUnreliableCommands).sentinel)))
       ) {
      enet_peer_disconnect(peer,peer->eventData);
    }
    return local_80;
  }
  pEVar4 = &peer->sentReliableCommands;
  bVar25 = false;
  local_80 = 1;
  bVar12 = false;
  uVar37 = 0;
  local_60 = 0;
LAB_00107c83:
  do {
    bVar33 = *(byte *)&p_Var35[2].previous;
    bVar13 = (char)bVar33 >= '\0';
    p_Var36 = p_Var35;
    if ((char)bVar33 < '\0') {
      do {
        bVar29 = *(byte *)((long)&p_Var35[2].previous + 1);
        if ((ulong)bVar29 < peer->channelCount) {
          local_60 = (long)peer->channels->reliableWindows + ((ulong)((uint)bVar29 * 0x50) - 6);
        }
        else {
          local_60 = 0;
        }
        uVar8 = *(ushort *)&p_Var35[1].next;
        uVar37 = (uint)(uVar8 >> 0xc);
        if (local_60 == 0) {
LAB_00107ec5:
          if (p_Var35[5].previous != (_ENetListNode *)0x0) {
            if (!bVar12) {
              uVar26 = peer->windowSize * peer->packetThrottle >> 5;
              if (uVar26 <= peer->mtu) {
                uVar26 = peer->mtu;
              }
              bVar12 = uVar26 < (uint)*(ushort *)((long)&p_Var35[2].next + 4) +
                                peer->reliableDataInTransit;
            }
            if (bVar12) goto LAB_00107ea0;
            bVar12 = false;
          }
          local_80 = 0;
          p_Var36 = p_Var35;
          break;
        }
        if (((!bVar25) &&
            (bVar25 = false, (uVar8 & 0xfff) == 0 && *(short *)((long)&p_Var35[2].next + 6) == 0))
           && ((0xfff < *(ushort *)(local_60 + 6 + (ulong)(uVar37 - 1 & 0xf) * 2) ||
               (bVar29 = (byte)(uVar8 >> 0xc),
               ((0x3ffU >> (0x10 - bVar29 & 0x1f) | 0x3ff << bVar29) &
               (uint)*(ushort *)(local_60 + 4)) != 0)))) {
          bVar25 = true;
        }
        if (!bVar25) {
          bVar25 = false;
          goto LAB_00107ec5;
        }
LAB_00107ea0:
        p_Var35 = p_Var35->next;
        if (p_Var35 == &pEVar3->sentinel) goto LAB_001080f6;
        bVar33 = *(byte *)&p_Var35[2].previous;
        bVar13 = (char)bVar33 >= '\0';
        p_Var36 = p_Var35;
      } while ((char)bVar33 < '\0');
    }
    if (0xa97 < lVar34 || 0x68b < lVar30) {
LAB_001080df:
      host->continueSending = 1;
      goto LAB_001080f6;
    }
    uVar28 = commandSizes[bVar33 & 0xf];
    sVar9 = host->packetSize;
    uVar31 = peer->mtu - sVar9;
    if ((uVar31 < uVar28) ||
       ((p_Var10 = p_Var36[5].previous, p_Var10 != (_ENetListNode *)0x0 &&
        (((uint)uVar31 & 0xffff) <
         (uint)(ushort)(*(short *)((long)&p_Var36[2].next + 4) + (short)uVar28)))))
    goto LAB_001080df;
    p_Var35 = p_Var36->next;
    if (!bVar13) {
      if ((local_60 != 0) && (*(short *)((long)&p_Var36[2].next + 6) == 0)) {
        *(ushort *)(local_60 + 4) = *(ushort *)(local_60 + 4) | (ushort)(1 << (sbyte)uVar37);
        psVar5 = (short *)(local_60 + 6 + (ulong)uVar37 * 2);
        *psVar5 = *psVar5 + 1;
      }
      psVar5 = (short *)((long)&p_Var36[2].next + 6);
      *psVar5 = *psVar5 + 1;
      if (*(int *)&p_Var36[1].previous == 0) {
        iVar27 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
        *(int *)&p_Var36[1].previous = iVar27;
        *(uint32_t *)((long)&p_Var36[1].previous + 4) = iVar27 * peer->timeoutLimit;
      }
      if ((pEVar4->sentinel).next == &pEVar4->sentinel) {
        peer->nextTimeout = *(int *)&p_Var36[1].previous + host->serviceTime;
      }
      p_Var10 = p_Var36->previous;
      p_Var10->next = p_Var35;
      p_Var36->next->previous = p_Var10;
      p_Var10 = (peer->sentReliableCommands).sentinel.previous;
      p_Var36->previous = p_Var10;
      p_Var36->next = &pEVar4->sentinel;
      p_Var10->next = p_Var36;
      (peer->sentReliableCommands).sentinel.previous = p_Var36;
      *(uint32_t *)((long)&p_Var36[1].next + 4) = host->serviceTime;
      pbVar2 = (byte *)((long)&host->headerFlags + 1);
      *pbVar2 = *pbVar2 | 0x40;
      peer->reliableDataInTransit =
           peer->reliableDataInTransit + (uint)*(ushort *)((long)&p_Var36[2].next + 4);
      goto LAB_00108032;
    }
    if ((((p_Var10 == (_ENetListNode *)0x0) || (*(int *)&p_Var36[2].next != 0)) ||
        (((ulong)p_Var10->next & 0x20) != 0)) ||
       (uVar26 = peer->packetThrottleCounter + 7 & 0x1f, peer->packetThrottleCounter = uVar26,
       uVar26 <= peer->packetThrottle)) break;
    sVar6 = *(short *)&p_Var36[1].next;
    sVar7 = *(short *)((long)&p_Var36[1].next + 2);
    p_Var10 = p_Var35;
    while( true ) {
      p_Var35 = p_Var10;
      p_Var10 = p_Var36[5].previous;
      pp_Var1 = &p_Var10[1].previous;
      *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
      if (p_Var10 != (_ENetListNode *)0x0 && *(int *)pp_Var1 == 0) {
        if (p_Var10[1].next != (_ENetListNode *)0x0) {
          (*(code *)p_Var10[1].next)(p_Var10);
        }
        (*(code *)callbacks_1)(p_Var10);
      }
      p_Var10 = p_Var36->previous;
      p_Var10->next = p_Var36->next;
      p_Var36->next->previous = p_Var10;
      (*(code *)callbacks_1)(p_Var36);
      if (((p_Var35 == &pEVar3->sentinel) || (*(short *)&p_Var35[1].next != sVar6)) ||
         (*(short *)((long)&p_Var35[1].next + 2) != sVar7)) break;
      p_Var10 = p_Var35->next;
      p_Var36 = p_Var35;
    }
    if (p_Var35 == &pEVar3->sentinel) goto LAB_001080f6;
  } while( true );
  p_Var11 = p_Var36->previous;
  p_Var11->next = p_Var35;
  p_Var36->next->previous = p_Var11;
  if (p_Var10 != (_ENetListNode *)0x0) {
    p_Var10 = (peer->sentUnreliableCommands).sentinel.previous;
    p_Var36->previous = p_Var10;
    p_Var36->next = &(peer->sentUnreliableCommands).sentinel;
    p_Var10->next = p_Var36;
    (peer->sentUnreliableCommands).sentinel.previous = p_Var36;
  }
LAB_00108032:
  puVar32 = (undefined4 *)((long)&host->socket + lVar30);
  *(undefined4 **)((long)&host->socket + lVar34) = puVar32;
  *(ulong *)((long)&(host->address).field_0 + lVar34 + 4) = uVar28;
  host->packetSize = sVar9 + uVar28;
  uVar14 = *(undefined4 *)&p_Var36[2].previous;
  uVar15 = *(undefined4 *)((long)&p_Var36[2].previous + 4);
  uVar16 = *(undefined4 *)&p_Var36[3].next;
  uVar17 = *(undefined4 *)((long)&p_Var36[3].next + 4);
  uVar18 = *(undefined4 *)&p_Var36[3].previous;
  uVar19 = *(undefined4 *)((long)&p_Var36[3].previous + 4);
  uVar20 = *(undefined4 *)&p_Var36[4].next;
  uVar21 = *(undefined4 *)((long)&p_Var36[4].next + 4);
  uVar22 = *(undefined4 *)((long)&p_Var36[4].previous + 4);
  uVar23 = *(undefined4 *)&p_Var36[5].next;
  uVar24 = *(undefined4 *)((long)&p_Var36[5].next + 4);
  puVar32[8] = *(undefined4 *)&p_Var36[4].previous;
  puVar32[9] = uVar22;
  puVar32[10] = uVar23;
  puVar32[0xb] = uVar24;
  puVar32[4] = uVar18;
  puVar32[5] = uVar19;
  puVar32[6] = uVar20;
  puVar32[7] = uVar21;
  *puVar32 = uVar14;
  puVar32[1] = uVar15;
  puVar32[2] = uVar16;
  puVar32[3] = uVar17;
  if (p_Var36[5].previous == (_ENetListNode *)0x0) {
    if (-1 < *(char *)&p_Var36[2].previous) {
      (*(code *)callbacks_1)(p_Var36);
    }
  }
  else {
    *(ulong *)((long)host->commands + lVar34 + -0x7c) =
         (long)&(p_Var36[5].previous)->previous->next + (ulong)*(uint *)&p_Var36[2].next;
    uVar28 = (ulong)*(ushort *)((long)&p_Var36[2].next + 4);
    *(ulong *)((long)host->commands + lVar34 + -0x74) = uVar28;
    lVar34 = lVar34 + 0x10;
    host->packetSize = host->packetSize + uVar28;
  }
  peer->totalPacketsSent = peer->totalPacketsSent + 1;
  lVar30 = lVar30 + 0x30;
  lVar34 = lVar34 + 0x10;
  if (p_Var35 == &pEVar3->sentinel) goto LAB_001080f6;
  goto LAB_00107c83;
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost* host, ENetPeer* peer) {
	ENetProtocol* command = &host->commands[host->commandCount];
	ENetBuffer* buffer = &host->buffers[host->bufferCount];
	ENetOutgoingCommand* outgoingCommand;
	ENetListIterator currentCommand;
	ENetChannel* channel = NULL;
	uint16_t reliableWindow = 0;
	size_t commandSize = 0;
	int windowExceeded = 0, windowWrap = 0, canPing = 1;
	currentCommand = enet_list_begin(&peer->outgoingCommands);

	while (currentCommand != enet_list_end(&peer->outgoingCommands)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			channel = outgoingCommand->command.header.channelID < peer->channelCount ? &peer->channels[outgoingCommand->command.header.channelID] : NULL;
			reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

			if (channel != NULL) {
				if (!windowWrap && outgoingCommand->sendAttempts < 1 && !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) && (channel->reliableWindows[(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE || channel->usedReliableWindows & ((((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | (((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
					windowWrap = 1;

				if (windowWrap) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			if (outgoingCommand->packet != NULL) {
				if (!windowExceeded) {
					uint32_t windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

					if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX(windowSize, peer->mtu))
						windowExceeded = 1;
				}

				if (windowExceeded) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			canPing = 0;
		}

		commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];

		if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] || buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] || peer->mtu - host->packetSize < commandSize || (outgoingCommand->packet != NULL && (uint16_t)(peer->mtu - host->packetSize) < (uint16_t)(commandSize + outgoingCommand->fragmentLength))) {
			host->continueSending = 1;

			break;
		}

		currentCommand = enet_list_next(currentCommand);

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			if (channel != NULL && outgoingCommand->sendAttempts < 1) {
				channel->usedReliableWindows |= 1 << reliableWindow;
				++channel->reliableWindows[reliableWindow];
			}

			++outgoingCommand->sendAttempts;

			if (outgoingCommand->roundTripTimeout == 0) {
				outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
				outgoingCommand->roundTripTimeoutLimit = peer->timeoutLimit * outgoingCommand->roundTripTimeout;
			}

			if (enet_list_empty(&peer->sentReliableCommands))
				peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;

			enet_list_insert(enet_list_end(&peer->sentReliableCommands),
				enet_list_remove(&outgoingCommand->outgoingCommandList));

			outgoingCommand->sentTime = host->serviceTime;
			host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
			peer->reliableDataInTransit += outgoingCommand->fragmentLength;
		}
		else {
			if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0 && !(outgoingCommand->packet->flags & (ENET_PACKET_FLAG_UNTHROTTLED))) {
				peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
				peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

				if (peer->packetThrottleCounter > peer->packetThrottle) {
					uint16_t reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,

						unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;

					for (;;) {
						--outgoingCommand->packet->referenceCount;

						if (outgoingCommand->packet->referenceCount == 0)
							enet_packet_destroy(outgoingCommand->packet);

						enet_list_remove(&outgoingCommand->outgoingCommandList);
						enet_free(outgoingCommand);

						if (currentCommand == enet_list_end(&peer->outgoingCommands))
							break;

						outgoingCommand = (ENetOutgoingCommand*)currentCommand;

						if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber || outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber)
							break;

						currentCommand = enet_list_next(currentCommand);
					}

					continue;
				}
			}

			enet_list_remove(&outgoingCommand->outgoingCommandList);

			if (outgoingCommand->packet != NULL)
				enet_list_insert(enet_list_end(&peer->sentUnreliableCommands), outgoingCommand);
		}

		buffer->data = command;
		buffer->dataLength = commandSize;
		host->packetSize += buffer->dataLength;
		*command = outgoingCommand->command;

		if (outgoingCommand->packet != NULL) {
			++buffer;
			buffer->data = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
			buffer->dataLength = outgoingCommand->fragmentLength;
			host->packetSize += outgoingCommand->fragmentLength;
		}
		else if (!(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
			enet_free(outgoingCommand);
		}

		++peer->totalPacketsSent;
		++command;
		++buffer;
	}

	host->commandCount = command - host->commands;
	host->bufferCount = buffer - host->buffers;

	if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER && enet_list_empty(&peer->outgoingCommands) && enet_list_empty(&peer->sentReliableCommands) && enet_list_empty(&peer->sentUnreliableCommands))
		enet_peer_disconnect(peer, peer->eventData);

	return canPing;
}